

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet.c
# Opt level: O0

int uv_inet_pton(int af,char *src,void *dst)

{
  char *pcVar1;
  char *p;
  char *s;
  char tmp [46];
  int len;
  void *dst_local;
  char *src_local;
  int af_local;
  
  if ((src == (char *)0x0) || (dst == (void *)0x0)) {
    src_local._4_4_ = -0x16;
  }
  else if (af == 2) {
    src_local._4_4_ = inet_pton4(src,(uchar *)dst);
  }
  else if (af == 10) {
    pcVar1 = strchr(src,0x25);
    p = src;
    if (pcVar1 != (char *)0x0) {
      p = (char *)&s;
      register0x00000000 = (int)pcVar1 - (int)src;
      if (0x2d < register0x00000000) {
        return -0x16;
      }
      memcpy(p,src,(long)register0x00000000);
      *(undefined1 *)((long)p + (long)stack0xffffffffffffffdc) = 0;
    }
    src_local._4_4_ = inet_pton6(p,(uchar *)dst);
  }
  else {
    src_local._4_4_ = -0x61;
  }
  return src_local._4_4_;
}

Assistant:

int uv_inet_pton(int af, const char* src, void* dst) {
  if (src == NULL || dst == NULL)
    return UV_EINVAL;

  switch (af) {
  case AF_INET:
    return (inet_pton4(src, dst));
  case AF_INET6: {
    int len;
    char tmp[UV__INET6_ADDRSTRLEN], *s, *p;
    s = (char*) src;
    p = strchr(src, '%');
    if (p != NULL) {
      s = tmp;
      len = p - src;
      if (len > UV__INET6_ADDRSTRLEN-1)
        return UV_EINVAL;
      memcpy(s, src, len);
      s[len] = '\0';
    }
    return inet_pton6(s, dst);
  }
  default:
    return UV_EAFNOSUPPORT;
  }
  /* NOTREACHED */
}